

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

void __thiscall helics::apps::Recorder::loadTextFile(Recorder *this,string *textFile)

{
  string_view quoteChars;
  stringOps *this_00;
  char cVar1;
  int iVar2;
  istream *piVar3;
  void *pvVar4;
  long lVar5;
  ostream *poVar6;
  char *pcVar7;
  int iVar8;
  stringOps *psVar9;
  string_view key;
  string_view key_00;
  string_view sourceEndpoint;
  string_view endpoint;
  string_view destEndpoint;
  string_view sourceEndpoint_00;
  string_view destEndpoint_00;
  string_view sourceEndpoint_01;
  string_view destEndpoint_01;
  string_view line;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  stringVector blk;
  string str;
  ifstream infile;
  delimiter_compression in_stack_fffffffffffffd48;
  string local_2b0;
  stringVector local_290;
  Recorder *local_278;
  char *local_270;
  stringOps *local_268;
  char local_260;
  undefined7 uStack_25f;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_250;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,(string *)textFile,_S_in);
  local_270 = &local_260;
  local_268 = (stringOps *)0x0;
  local_260 = '\0';
  local_250 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &this->captureInterfaces;
  iVar8 = 0;
  local_278 = this;
  do {
    do {
      do {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_270,cVar1);
        this_00 = local_268;
        pcVar7 = local_270;
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          std::ifstream::close();
          if (local_270 != &local_260) {
            operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
          }
          std::ifstream::~ifstream(local_238);
          return;
        }
        iVar8 = iVar8 + 1;
      } while (local_268 == (stringOps *)0x0);
      psVar9 = (stringOps *)0x0;
      do {
        pvVar4 = memchr(" \t\n\r",(int)pcVar7[(long)psVar9],4);
        if (pvVar4 == (void *)0x0) goto LAB_001d2221;
        psVar9 = psVar9 + 1;
      } while (this_00 != psVar9);
      psVar9 = (stringOps *)0xffffffffffffffff;
LAB_001d2221:
    } while ((psVar9 == (stringOps *)0xffffffffffffffff) || (local_270[(long)psVar9] == '#'));
    quoteChars._M_str = (char *)0x415857;
    quoteChars._M_len = 3;
    line._M_str = (char *)0x3;
    line._M_len = (size_t)local_270;
    pcVar7 = (char *)0x3;
    gmlc::utilities::stringOps::splitlineQuotes_abi_cxx11_
              (&local_290,this_00,line,(string_view)ZEXT816(0x41571b),quoteChars,
               in_stack_fffffffffffffd48);
    lVar5 = (long)local_290.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_290.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (lVar5 == 1) {
      str_00._M_str = pcVar7;
      str_00._M_len =
           (size_t)((local_290.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                (&local_2b0,
                 (stringOps *)
                 (local_290.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,str_00);
      key._M_str._1_7_ = local_2b0._M_dataplus._M_p._1_7_;
      key._M_str._0_1_ = local_2b0._M_dataplus._M_p._0_1_;
      key._M_len = local_2b0._M_string_length;
      addSubscription(local_278,key);
LAB_001d26da:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_2b0._M_dataplus._M_p._1_7_,local_2b0._M_dataplus._M_p._0_1_) !=
          &local_2b0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_2b0._M_dataplus._M_p._1_7_,local_2b0._M_dataplus._M_p._0_1_),
                        local_2b0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (lVar5 == 2) {
        iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(local_290.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"subscription");
        if (iVar2 != 0) {
          iVar2 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (local_290.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,"s");
          if (iVar2 != 0) {
            iVar2 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (local_290.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,"sub");
            if (iVar2 != 0) {
              iVar2 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (local_290.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,"tag");
              if (iVar2 != 0) {
                iVar2 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (local_290.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,"endpoint");
                if (iVar2 != 0) {
                  iVar2 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (local_290.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start,"ept");
                  if (iVar2 != 0) {
                    iVar2 = CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(local_290.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"e");
                    if (iVar2 != 0) {
                      iVar2 = CLI::std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare(local_290.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,"sourceclone");
                      if (iVar2 != 0) {
                        iVar2 = CLI::std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                compare(local_290.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"source");
                        if (iVar2 != 0) {
                          iVar2 = CLI::std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::compare(local_290.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,"src");
                          if (iVar2 != 0) {
                            iVar2 = CLI::std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::compare(local_290.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,"destclone")
                            ;
                            if (iVar2 != 0) {
                              iVar2 = CLI::std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      ::compare(local_290.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start,"dest");
                              if (iVar2 != 0) {
                                iVar2 = CLI::std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        ::compare(local_290.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "destination");
                                if (iVar2 != 0) {
                                  iVar2 = CLI::std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          ::compare(local_290.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "capture");
                                  if (iVar2 == 0) {
                                    str_07._M_str = pcVar7;
                                    str_07._M_len =
                                         (size_t)local_290.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                                 _M_dataplus._M_p;
                                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                              (&local_2b0,
                                               (stringOps *)
                                               local_290.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].
                                               _M_string_length,str_07);
                                    local_248._M_str =
                                         (char *)CONCAT71(local_2b0._M_dataplus._M_p._1_7_,
                                                          local_2b0._M_dataplus._M_p._0_1_);
                                    local_248._M_len = local_2b0._M_string_length;
                                    std::
                                    vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    ::
                                    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                                              (local_250,&local_248);
                                  }
                                  else {
                                    iVar2 = CLI::std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            ::compare(local_290.
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,"clone")
                                    ;
                                    if (iVar2 != 0) {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cerr,"Unable to process line ",
                                                 0x17);
                                      poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,iVar8)
                                      ;
                                      local_2b0._M_dataplus._M_p._0_1_ = 0x3a;
                                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                                         (poVar6,(char *)&local_2b0,1);
                                      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                                         (poVar6,local_270,(long)local_268);
                                      local_2b0._M_dataplus._M_p._0_1_ = 10;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar6,(char *)&local_2b0,1);
                                      goto LAB_001d26f6;
                                    }
                                    str_08._M_str = pcVar7;
                                    str_08._M_len =
                                         (size_t)local_290.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                                 _M_dataplus._M_p;
                                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                              (&local_2b0,
                                               (stringOps *)
                                               local_290.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].
                                               _M_string_length,str_08);
                                    sourceEndpoint_01._M_str._1_7_ =
                                         local_2b0._M_dataplus._M_p._1_7_;
                                    sourceEndpoint_01._M_str._0_1_ =
                                         local_2b0._M_dataplus._M_p._0_1_;
                                    sourceEndpoint_01._M_len = local_2b0._M_string_length;
                                    addSourceEndpointClone(local_278,sourceEndpoint_01);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)CONCAT71(local_2b0._M_dataplus._M_p._1_7_,
                                                    local_2b0._M_dataplus._M_p._0_1_) !=
                                        &local_2b0.field_2) {
                                      operator_delete((undefined1 *)
                                                      CONCAT71(local_2b0._M_dataplus._M_p._1_7_,
                                                               local_2b0._M_dataplus._M_p._0_1_),
                                                      local_2b0.field_2._M_allocated_capacity + 1);
                                    }
                                    str_09._M_str = pcVar7;
                                    str_09._M_len =
                                         (size_t)local_290.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                                 _M_dataplus._M_p;
                                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                              (&local_2b0,
                                               (stringOps *)
                                               local_290.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].
                                               _M_string_length,str_09);
                                    destEndpoint_01._M_str._1_7_ = local_2b0._M_dataplus._M_p._1_7_;
                                    destEndpoint_01._M_str._0_1_ = local_2b0._M_dataplus._M_p._0_1_;
                                    destEndpoint_01._M_len = local_2b0._M_string_length;
                                    addDestEndpointClone(local_278,destEndpoint_01);
                                  }
                                  goto LAB_001d26da;
                                }
                              }
                            }
                            str_06._M_str = pcVar7;
                            str_06._M_len =
                                 (size_t)local_290.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                         _M_p;
                            gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                      (&local_2b0,
                                       (stringOps *)
                                       local_290.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length
                                       ,str_06);
                            destEndpoint_00._M_str._1_7_ = local_2b0._M_dataplus._M_p._1_7_;
                            destEndpoint_00._M_str._0_1_ = local_2b0._M_dataplus._M_p._0_1_;
                            destEndpoint_00._M_len = local_2b0._M_string_length;
                            addDestEndpointClone(local_278,destEndpoint_00);
                            goto LAB_001d26da;
                          }
                        }
                      }
                      str_05._M_str = pcVar7;
                      str_05._M_len =
                           (size_t)local_290.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
                      gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                                (&local_2b0,
                                 (stringOps *)
                                 local_290.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,
                                 str_05);
                      sourceEndpoint_00._M_str._1_7_ = local_2b0._M_dataplus._M_p._1_7_;
                      sourceEndpoint_00._M_str._0_1_ = local_2b0._M_dataplus._M_p._0_1_;
                      sourceEndpoint_00._M_len = local_2b0._M_string_length;
                      addSourceEndpointClone(local_278,sourceEndpoint_00);
                      goto LAB_001d26da;
                    }
                  }
                }
                str_03._M_str = pcVar7;
                str_03._M_len =
                     (size_t)local_290.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
                gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                          (&local_2b0,
                           (stringOps *)
                           local_290.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,str_03);
                endpoint._M_str._1_7_ = local_2b0._M_dataplus._M_p._1_7_;
                endpoint._M_str._0_1_ = local_2b0._M_dataplus._M_p._0_1_;
                endpoint._M_len = local_2b0._M_string_length;
                addEndpoint(local_278,endpoint);
                goto LAB_001d26da;
              }
            }
          }
        }
        str_01._M_str = pcVar7;
        str_01._M_len =
             (size_t)local_290.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                  (&local_2b0,
                   (stringOps *)
                   local_290.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length,str_01);
        key_00._M_str._1_7_ = local_2b0._M_dataplus._M_p._1_7_;
        key_00._M_str._0_1_ = local_2b0._M_dataplus._M_p._0_1_;
        key_00._M_len = local_2b0._M_string_length;
        addSubscription(local_278,key_00);
        goto LAB_001d26da;
      }
      if (lVar5 == 3) {
        iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(local_290.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"clone");
        if (iVar2 == 0) {
          iVar2 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (local_290.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1,"source");
          if (iVar2 != 0) {
            iVar2 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (local_290.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1,"src");
            if (iVar2 != 0) {
              iVar2 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (local_290.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1,"dest");
              if (iVar2 != 0) {
                iVar2 = CLI::std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (local_290.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1,"destination");
                if (iVar2 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Unable to process line ",0x17);
                  poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,iVar8);
                  local_2b0._M_dataplus._M_p._0_1_ = 0x3a;
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar6,(char *)&local_2b0,1);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar6,local_270,(long)local_268);
                  local_2b0._M_dataplus._M_p._0_1_ = 10;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_2b0,1);
                  goto LAB_001d26f6;
                }
              }
              str_04._M_str = pcVar7;
              str_04._M_len =
                   (size_t)local_290.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
              gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                        (&local_2b0,
                         (stringOps *)
                         local_290.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length,str_04);
              destEndpoint._M_str._1_7_ = local_2b0._M_dataplus._M_p._1_7_;
              destEndpoint._M_str._0_1_ = local_2b0._M_dataplus._M_p._0_1_;
              destEndpoint._M_len = local_2b0._M_string_length;
              addDestEndpointClone(local_278,destEndpoint);
              goto LAB_001d26da;
            }
          }
          str_02._M_str = pcVar7;
          str_02._M_len =
               (size_t)local_290.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          gmlc::utilities::stringOps::removeQuotes_abi_cxx11_
                    (&local_2b0,
                     (stringOps *)
                     local_290.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length,str_02);
          sourceEndpoint._M_str._1_7_ = local_2b0._M_dataplus._M_p._1_7_;
          sourceEndpoint._M_str._0_1_ = local_2b0._M_dataplus._M_p._0_1_;
          sourceEndpoint._M_len = local_2b0._M_string_length;
          addSourceEndpointClone(local_278,sourceEndpoint);
          goto LAB_001d26da;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unable to process line ",0x17);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,iVar8);
        local_2b0._M_dataplus._M_p._0_1_ = 0x3a;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_2b0,1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_270,(long)local_268);
        local_2b0._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_2b0,1);
      }
    }
LAB_001d26f6:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_290);
  } while( true );
}

Assistant:

void Recorder::loadTextFile(const std::string& textFile)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT

    std::ifstream infile(textFile);
    std::string str;
    int lineCount = 0;
    while (std::getline(infile, str)) {
        ++lineCount;
        if (str.empty()) {
            continue;
        }
        auto firstChar = str.find_first_not_of(" \t\n\r\0");
        if ((firstChar == std::string::npos) || (str[firstChar] == '#')) {
            continue;
        }
        auto blk = splitlineQuotes(str, ",\t ", default_quote_chars, delimiter_compression::on);

        switch (blk.size()) {
            case 1:
                addSubscription(removeQuotes(blk[0]));
                break;
            case 2:
                if ((blk[0] == "subscription") || (blk[0] == "s") || (blk[0] == "sub") ||
                    (blk[0] == "tag")) {
                    addSubscription(removeQuotes(blk[1]));
                } else if ((blk[0] == "endpoint") || (blk[0] == "ept") || (blk[0] == "e")) {
                    addEndpoint(removeQuotes(blk[1]));
                } else if ((blk[0] == "sourceclone") || (blk[0] == "source") || (blk[0] == "src")) {
                    addSourceEndpointClone(removeQuotes(blk[1]));
                } else if ((blk[0] == "destclone") || (blk[0] == "dest") ||
                           (blk[0] == "destination")) {
                    addDestEndpointClone(removeQuotes(blk[1]));
                } else if (blk[0] == "capture") {
                    addCapture(removeQuotes(blk[1]));
                } else if (blk[0] == "clone") {
                    addSourceEndpointClone(removeQuotes(blk[1]));
                    addDestEndpointClone(removeQuotes(blk[1]));
                } else {
                    std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                }
                break;
            case 3:
                if (blk[0] == "clone") {
                    if ((blk[1] == "source") || (blk[1] == "src")) {
                        addSourceEndpointClone(removeQuotes(blk[2]));
                    } else if ((blk[1] == "dest") || (blk[1] == "destination")) {
                        addDestEndpointClone(removeQuotes(blk[2]));
                    } else {
                        std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                    }
                } else {
                    std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                }
                break;
            default:
                break;
        }
    }
    infile.close();
}